

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O1

void __thiscall
GlobOpt::InsertValueCompensation
          (GlobOpt *this,BasicBlock *predecessor,BasicBlock *successor,
          SymToValueInfoMap *symsRequiringCompensationToMergedValueInfoMap)

{
  ValueType VVar1;
  BasicBlock *pBVar2;
  JitArenaAllocator *alloc;
  code *pcVar3;
  uint uVar4;
  undefined8 uVar5;
  int right;
  bool bVar6;
  BOOLEAN BVar7;
  bool bVar8;
  anon_union_2_4_ea848c7b_for_ValueType_13 aVar9;
  BOOL BVar10;
  undefined4 *puVar11;
  EntryType *pEVar12;
  Value *pVVar13;
  ArrayValueInfo *pAVar14;
  RegOpnd *pRVar15;
  RegOpnd *pRVar16;
  Instr *pIVar17;
  Value *pVVar18;
  ValueInfo *pVVar19;
  Value *toDataVal;
  _func_int **dst;
  _func_int **pp_Var20;
  Func **ppFVar21;
  GlobOptBlockData *this_00;
  long lVar22;
  StackSym *pSVar23;
  StackSym *pSVar24;
  ValueType *pVVar25;
  StackSym *sym;
  size_t requestedBytes;
  long lVar26;
  undefined1 local_128 [8];
  EntryIterator<const_JsUtil::BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
  it;
  int32 local_e4;
  undefined1 auStack_e0 [4];
  int32 newBufferSize;
  List<DelayChangeValueInfo,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  delayChangeValueInfo;
  int32 local_98;
  uint local_94;
  StackSym *local_90;
  GlobOptBlockData *local_88;
  StackSym *local_80;
  Instr *local_78;
  JitArenaAllocator *local_70;
  BasicBlock *local_68;
  GlobOpt *local_60;
  StackSym *local_58;
  Func *local_50;
  int32 local_44;
  undefined4 *puStack_40;
  int32 newLength;
  bool local_31;
  
  local_68 = predecessor;
  local_60 = this;
  if (predecessor == (BasicBlock *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x49a,"(predecessor)","predecessor");
    if (!bVar6) goto LAB_0044311e;
    *puVar11 = 0;
  }
  if (successor == (BasicBlock *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x49b,"(successor)","successor");
    if (!bVar6) goto LAB_0044311e;
    *puVar11 = 0;
  }
  if (local_68 == successor) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x49c,"(predecessor != successor)","predecessor != successor");
    if (!bVar6) goto LAB_0044311e;
    *puVar11 = 0;
  }
  if (symsRequiringCompensationToMergedValueInfoMap->count ==
      symsRequiringCompensationToMergedValueInfoMap->freeCount) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x49d,"(symsRequiringCompensationToMergedValueInfoMap->Count() != 0)",
                       "symsRequiringCompensationToMergedValueInfoMap->Count() != 0");
    if (!bVar6) goto LAB_0044311e;
    *puVar11 = 0;
  }
  pBVar2 = local_68->next;
  ppFVar21 = (Func **)&pBVar2->firstInstr;
  if (pBVar2 == (BasicBlock *)0x0) {
    ppFVar21 = &local_68->func;
  }
  lVar22 = 0x18;
  if (pBVar2 == (BasicBlock *)0x0) {
    lVar22 = 0xd0;
  }
  pIVar17 = *(Instr **)((long)&(*ppFVar21)->m_alloc + lVar22);
  local_31 = true;
  if ((local_60->field_0xf4 & 0x80) != 0) {
    local_31 = successor->dataUseCount != 0;
  }
  local_50 = pIVar17->m_func;
  if ((pIVar17->m_kind == InstrKindBranch) || (pIVar17->m_opcode == BailTarget)) {
    do {
      local_78 = pIVar17;
      pIVar17 = local_78->m_prev;
    } while (local_78->m_prev->m_opcode == ByteCodeUses);
  }
  else {
    if (pIVar17->m_next == (Instr *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x4b2,"(insertBeforeInstr->m_next)","insertBeforeInstr->m_next");
      if (!bVar6) {
LAB_0044311e:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar11 = 0;
    }
    local_78 = pIVar17->m_next;
  }
  delayChangeValueInfo.
  super_ReadOnlyList<DelayChangeValueInfo,_Memory::ArenaAllocator,_DefaultComparer>._16_8_ =
       local_60->alloc;
  delayChangeValueInfo.
  super_ReadOnlyList<DelayChangeValueInfo,_Memory::ArenaAllocator,_DefaultComparer>.
  _vptr_ReadOnlyList = (_func_int **)0x0;
  delayChangeValueInfo.
  super_ReadOnlyList<DelayChangeValueInfo,_Memory::ArenaAllocator,_DefaultComparer>.buffer._0_4_ = 0
  ;
  _auStack_e0 = &PTR_IsReadOnly_014ea538;
  delayChangeValueInfo.
  super_ReadOnlyList<DelayChangeValueInfo,_Memory::ArenaAllocator,_DefaultComparer>.alloc =
       (Type)0x400000000;
  JsUtil::
  BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::
  EntryIterator<const_JsUtil::BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
  ::EntryIterator((EntryIterator<const_JsUtil::BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                   *)local_128,symsRequiringCompensationToMergedValueInfoMap);
  local_88 = &local_68->globOptData;
  this_00 = &successor->globOptData;
  puStack_40 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  do {
    bVar6 = JsUtil::
            BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::
            EntryIterator<const_JsUtil::BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
            ::IsValid((EntryIterator<const_JsUtil::BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                       *)local_128);
    pp_Var20 = delayChangeValueInfo.
               super_ReadOnlyList<DelayChangeValueInfo,_Memory::ArenaAllocator,_DefaultComparer>.
               _vptr_ReadOnlyList;
    if (!bVar6) {
      lVar22 = (long)(int)delayChangeValueInfo.
                          super_ReadOnlyList<DelayChangeValueInfo,_Memory::ArenaAllocator,_DefaultComparer>
                          .buffer;
      if (0 < lVar22) {
        lVar26 = 0;
        do {
          ChangeValueInfo(local_60,local_68,*(Value **)((long)pp_Var20 + lVar26),
                          *(ValueInfo **)((long)pp_Var20 + lVar26 + 8),false,true);
          lVar26 = lVar26 + 0x10;
        } while (lVar22 * 0x10 != lVar26);
      }
      JsUtil::
      List<DelayChangeValueInfo,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
      ::~List((List<DelayChangeValueInfo,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               *)auStack_e0);
      return;
    }
    pEVar12 = JsUtil::
              BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ::
              IteratorBase<const_JsUtil::BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<const_JsUtil::BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
              ::Current((IteratorBase<const_JsUtil::BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<const_JsUtil::BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
                         *)local_128);
    pVVar13 = GlobOptBlockData::FindValue
                        (local_88,(pEVar12->
                                  super_DefaultHashedEntry<Sym_*,_ValueInfo_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                                  ).super_KeyValueEntry<Sym_*,_ValueInfo_*>.
                                  super_ValueEntry<ValueInfo_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Sym_*,_ValueInfo_*>_>
                                  .super_KeyValueEntryDataLayout2<Sym_*,_ValueInfo_*>.key);
    if (pVVar13 == (Value *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puStack_40 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x4cd,"(predecessorValue)","predecessorValue");
      if (!bVar6) goto LAB_0044311e;
      *puStack_40 = 0;
    }
    pVVar19 = pVVar13->valueInfo;
    bVar6 = ValueType::IsAnyOptimizedArray(&pVVar19->super_ValueType);
    if (!bVar6) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puStack_40 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x4d1,"(predecessorValueInfo->IsAnyOptimizedArray())",
                         "predecessorValueInfo->IsAnyOptimizedArray()");
      if (!bVar6) goto LAB_0044311e;
      *puStack_40 = 0;
    }
    it.
    super_IteratorBase<const_JsUtil::BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<const_JsUtil::BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
    ._24_8_ = pVVar19;
    pAVar14 = ValueInfo::AsArrayValueInfo(pVVar19);
    pSVar23 = pAVar14->headSegmentSym;
    sym = pAVar14->headSegmentLengthSym;
    local_80 = pAVar14->lengthSym;
    pAVar14 = ValueInfo::AsArrayValueInfo
                        ((pEVar12->
                         super_DefaultHashedEntry<Sym_*,_ValueInfo_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                         ).super_KeyValueEntry<Sym_*,_ValueInfo_*>.
                         super_ValueEntry<ValueInfo_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Sym_*,_ValueInfo_*>_>
                         .super_KeyValueEntryDataLayout2<Sym_*,_ValueInfo_*>.value);
    pSVar24 = pAVar14->headSegmentSym;
    local_58 = pAVar14->headSegmentLengthSym;
    local_90 = pAVar14->lengthSym;
    delayChangeValueInfo._40_8_ = pSVar23;
    if ((pSVar23 == (StackSym *)0x0) && (pSVar24 != (StackSym *)0x0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puStack_40 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x4db,"(!mergedHeadSegmentSym || predecessorHeadSegmentSym)",
                         "!mergedHeadSegmentSym || predecessorHeadSegmentSym");
      if (!bVar6) goto LAB_0044311e;
      *puStack_40 = 0;
    }
    if ((sym == (StackSym *)0x0) && (local_58 != (StackSym *)0x0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puStack_40 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x4dc,"(!mergedHeadSegmentLengthSym || predecessorHeadSegmentLengthSym)",
                         "!mergedHeadSegmentLengthSym || predecessorHeadSegmentLengthSym");
      if (!bVar6) goto LAB_0044311e;
      *puStack_40 = 0;
    }
    if ((local_80 == (StackSym *)0x0) && (local_90 != (StackSym *)0x0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puStack_40 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x4dd,"(!mergedLengthSym || predecessorLengthSym)",
                         "!mergedLengthSym || predecessorLengthSym");
      if (!bVar6) goto LAB_0044311e;
      *puStack_40 = 0;
    }
    bVar6 = (StackSym *)delayChangeValueInfo._40_8_ != pSVar24;
    if (bVar6 && pSVar24 != (StackSym *)0x0) {
      pRVar15 = IR::RegOpnd::New(pSVar24,pSVar24->m_type,local_50);
      pRVar16 = IR::RegOpnd::New((StackSym *)delayChangeValueInfo._40_8_,
                                 *(IRType *)(delayChangeValueInfo._40_8_ + 0x1c),local_50);
      pIVar17 = IR::Instr::New(Ld_A,&pRVar15->super_Opnd,&pRVar16->super_Opnd,local_50);
      IR::Opnd::SetIsJITOptimizedReg(pIVar17->m_dst,true);
      IR::Opnd::SetIsJITOptimizedReg(pIVar17->m_src1,true);
      IR::Instr::SetByteCodeOffset(pIVar17,local_78);
      IR::Instr::InsertBefore(local_78,pIVar17);
    }
    bVar6 = bVar6 && pSVar24 != (StackSym *)0x0;
    if ((local_58 != (StackSym *)0x0) && (sym != local_58)) {
      pRVar15 = IR::RegOpnd::New(local_58,local_58->m_type,local_50);
      pRVar16 = IR::RegOpnd::New(sym,sym->m_type,local_50);
      pIVar17 = IR::Instr::New(Ld_A,&pRVar15->super_Opnd,&pRVar16->super_Opnd,local_50);
      IR::Opnd::SetIsJITOptimizedReg(pIVar17->m_dst,true);
      IR::Opnd::SetIsJITOptimizedReg(pIVar17->m_src1,true);
      IR::Instr::SetByteCodeOffset(pIVar17,local_78);
      IR::Instr::InsertBefore(local_78,pIVar17);
      BVar7 = BVSparse<Memory::JitArenaAllocator>::Test
                        ((local_68->globOptData).liveVarSyms,(sym->super_Sym).m_id);
      if (BVar7 == '\0') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puStack_40 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x4fe,
                           "(predecessorBlockData.liveVarSyms->Test(predecessorHeadSegmentLengthSym->m_id))"
                           ,
                           "predecessorBlockData.liveVarSyms->Test(predecessorHeadSegmentLengthSym->m_id)"
                          );
        if (!bVar6) goto LAB_0044311e;
        *puStack_40 = 0;
      }
      BVSparse<Memory::JitArenaAllocator>::Set
                ((local_68->globOptData).liveVarSyms,(local_58->super_Sym).m_id);
      pVVar18 = GlobOptBlockData::FindValue(local_88,&sym->super_Sym);
      if (pVVar18 == (Value *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puStack_40 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x502,"(predecessorHeadSegmentLengthValue)",
                           "predecessorHeadSegmentLengthValue");
        if (!bVar6) goto LAB_0044311e;
        *puStack_40 = 0;
      }
      GlobOptBlockData::SetValue(local_88,pVVar18,&local_58->super_Sym);
      bVar6 = true;
      if (local_31 != false) {
        BVSparse<Memory::JitArenaAllocator>::Set
                  ((successor->globOptData).liveVarSyms,(local_58->super_Sym).m_id);
        local_70 = (JitArenaAllocator *)GlobOptBlockData::FindValue(this_00,&local_58->super_Sym);
        if (local_70 == (JitArenaAllocator *)0x0) {
          pVVar18 = CopyValue(local_60,pVVar18);
          GlobOptBlockData::SetValue(this_00,pVVar18,&local_58->super_Sym);
        }
        else {
          if (*(ValueNumber *)
               &(local_70->super_ArenaAllocator).
                super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                super_Allocator.outOfMemoryFunc == pVVar18->valueNumber) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puStack_40 = 1;
            bVar8 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0x50b,
                               "(mergedHeadSegmentLengthValue->GetValueNumber() != predecessorHeadSegmentLengthValue->GetValueNumber())"
                               ,
                               "mergedHeadSegmentLengthValue->GetValueNumber() != predecessorHeadSegmentLengthValue->GetValueNumber()"
                              );
            if (!bVar8) goto LAB_0044311e;
            *puStack_40 = 0;
          }
          pVVar19 = (ValueInfo *)
                    (local_70->super_ArenaAllocator).
                    super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                    super_Allocator.recoverMemoryFunc;
          if (pVVar18->valueInfo != pVVar19) {
            alloc = local_60->alloc;
            VVar1.field_0 =
                 (anon_union_2_4_ea848c7b_for_ValueType_13)
                 *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                  &(pVVar18->valueInfo->super_ValueType).field_0.field_0;
            ValueType::Verify((ValueType)
                              *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                               &(pVVar19->super_ValueType).field_0.field_0);
            ValueType::Verify(VVar1);
            pVVar25 = &pVVar19->super_ValueType;
            bVar8 = ValueType::operator==(pVVar25,VVar1);
            local_94 = (uint)(ushort)VVar1.field_0;
            if (bVar8) {
              aVar9.field_0 = (pVVar25->field_0).field_0;
            }
            else {
              ValueType::ValueType
                        ((ValueType *)&local_44,(pVVar25->field_0).bits | (ushort)VVar1.field_0);
              bVar8 = ValueType::OneOn((ValueType *)&local_44,Object);
              if (bVar8) {
                aVar9.field_0 =
                     (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                     ValueType::MergeWithObject(pVVar25,SUB42(local_94,0));
              }
              else {
                aVar9.field_0 =
                     (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                     ValueType::Verify(local_44._0_2_);
              }
            }
            pVVar19 = ValueInfo::MergeLikelyIntValueInfo
                                (alloc,(Value *)local_70,pVVar18,(ValueType)aVar9.field_0);
            ::Value::SetValueInfo((Value *)local_70,pVVar19);
          }
        }
      }
    }
    pSVar23 = local_90;
    if ((local_90 == (StackSym *)0x0) || (local_80 == local_90)) {
      if (bVar6) goto LAB_00442d31;
    }
    else {
      pRVar15 = IR::RegOpnd::New(local_90,local_90->m_type,local_50);
      pRVar16 = IR::RegOpnd::New(local_80,local_80->m_type,local_50);
      pIVar17 = IR::Instr::New(Ld_I4,&pRVar15->super_Opnd,&pRVar16->super_Opnd,local_50);
      IR::Opnd::SetIsJITOptimizedReg(pIVar17->m_dst,true);
      IR::Opnd::SetIsJITOptimizedReg(pIVar17->m_src1,true);
      IR::Instr::SetByteCodeOffset(pIVar17,local_78);
      IR::Instr::InsertBefore(local_78,pIVar17);
      BVar7 = BVSparse<Memory::JitArenaAllocator>::Test
                        ((local_68->globOptData).liveVarSyms,(local_80->super_Sym).m_id);
      if (BVar7 == '\0') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puStack_40 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x52d,
                           "(predecessorBlockData.liveVarSyms->Test(predecessorLengthSym->m_id))",
                           "predecessorBlockData.liveVarSyms->Test(predecessorLengthSym->m_id)");
        if (!bVar6) goto LAB_0044311e;
        *puStack_40 = 0;
      }
      BVSparse<Memory::JitArenaAllocator>::Set
                ((local_68->globOptData).liveVarSyms,(pSVar23->super_Sym).m_id);
      pVVar18 = GlobOptBlockData::FindValue(local_88,&local_80->super_Sym);
      if (pVVar18 == (Value *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puStack_40 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x530,"(predecessorLengthValue)","predecessorLengthValue");
        if (!bVar6) goto LAB_0044311e;
        *puStack_40 = 0;
      }
      GlobOptBlockData::SetValue(local_88,pVVar18,&pSVar23->super_Sym);
      pSVar23 = local_90;
      if (local_31 != false) {
        BVSparse<Memory::JitArenaAllocator>::Set
                  ((successor->globOptData).liveVarSyms,(local_90->super_Sym).m_id);
        toDataVal = GlobOptBlockData::FindValue(this_00,&pSVar23->super_Sym);
        if (toDataVal == (Value *)0x0) {
          pVVar18 = CopyValue(local_60,pVVar18);
          GlobOptBlockData::SetValue(this_00,pVVar18,&local_90->super_Sym);
        }
        else {
          if (toDataVal->valueNumber == pVVar18->valueNumber) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puStack_40 = 1;
            bVar6 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0x539,
                               "(mergedLengthValue->GetValueNumber() != predecessorLengthValue->GetValueNumber())"
                               ,
                               "mergedLengthValue->GetValueNumber() != predecessorLengthValue->GetValueNumber()"
                              );
            if (!bVar6) goto LAB_0044311e;
            *puStack_40 = 0;
          }
          pVVar19 = toDataVal->valueInfo;
          if (pVVar18->valueInfo != pVVar19) {
            local_70 = local_60->alloc;
            VVar1.field_0 =
                 (anon_union_2_4_ea848c7b_for_ValueType_13)
                 *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                  &(pVVar18->valueInfo->super_ValueType).field_0.field_0;
            ValueType::Verify((ValueType)
                              *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                               &(pVVar19->super_ValueType).field_0.field_0);
            ValueType::Verify(VVar1);
            pVVar25 = &pVVar19->super_ValueType;
            bVar6 = ValueType::operator==(pVVar25,VVar1);
            if (bVar6) {
              aVar9.field_0 = (pVVar25->field_0).field_0;
            }
            else {
              ValueType::ValueType
                        ((ValueType *)&local_44,(pVVar25->field_0).bits | (ushort)VVar1.field_0);
              bVar6 = ValueType::OneOn((ValueType *)&local_44,Object);
              if (bVar6) {
                aVar9.field_0 =
                     (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                     ValueType::MergeWithObject(pVVar25,VVar1);
              }
              else {
                aVar9.field_0 =
                     (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                     ValueType::Verify(local_44._0_2_);
              }
            }
            pVVar19 = ValueInfo::MergeLikelyIntValueInfo
                                (local_70,toDataVal,pVVar18,(ValueType)aVar9.field_0);
            ::Value::SetValueInfo(toDataVal,pVVar19);
          }
        }
      }
LAB_00442d31:
      pSVar23 = (StackSym *)delayChangeValueInfo._40_8_;
      if (pSVar24 != (StackSym *)0x0) {
        pSVar23 = pSVar24;
      }
      if (local_58 != (StackSym *)0x0) {
        sym = local_58;
      }
      pSVar24 = local_80;
      if (local_90 != (StackSym *)0x0) {
        pSVar24 = local_90;
      }
      pAVar14 = ArrayValueInfo::New(local_60->alloc,
                                    (ValueType)
                                    *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                                     &((anon_union_2_4_ea848c7b_for_ValueType_13 *)
                                      (it.
                                       super_IteratorBase<const_JsUtil::BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<const_JsUtil::BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
                                       ._24_8_ + 8))->field_0,pSVar23,sym,pSVar24,
                                    *(Sym **)(it.
                                              super_IteratorBase<const_JsUtil::BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<const_JsUtil::BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
                                              ._24_8_ + 0x10));
      uVar5 = delayChangeValueInfo.
              super_ReadOnlyList<DelayChangeValueInfo,_Memory::ArenaAllocator,_DefaultComparer>.
              _16_8_;
      pp_Var20 = delayChangeValueInfo.
                 super_ReadOnlyList<DelayChangeValueInfo,_Memory::ArenaAllocator,_DefaultComparer>.
                 _vptr_ReadOnlyList;
      if (delayChangeValueInfo.
          super_ReadOnlyList<DelayChangeValueInfo,_Memory::ArenaAllocator,_DefaultComparer>.
          _vptr_ReadOnlyList == (_func_int **)0x0) {
        uVar4 = delayChangeValueInfo.
                super_ReadOnlyList<DelayChangeValueInfo,_Memory::ArenaAllocator,_DefaultComparer>.
                alloc._4_4_;
        if ((int)delayChangeValueInfo.
                 super_ReadOnlyList<DelayChangeValueInfo,_Memory::ArenaAllocator,_DefaultComparer>.
                 alloc._4_4_ < 1) {
          uVar4 = 0;
        }
        if ((int)delayChangeValueInfo.
                 super_ReadOnlyList<DelayChangeValueInfo,_Memory::ArenaAllocator,_DefaultComparer>.
                 alloc._4_4_ < 1) {
          pp_Var20 = (_func_int **)&DAT_00000008;
        }
        else {
          BVar10 = ExceptionCheck::CanHandleOutOfMemory();
          if (BVar10 == 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puStack_40 = 1;
            bVar6 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                               ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                               "ExceptionCheck::CanHandleOutOfMemory()");
            if (!bVar6) goto LAB_0044311e;
            *puStack_40 = 0;
          }
          pp_Var20 = (_func_int **)
                     Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                     AllocInternal((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                    *)uVar5,(ulong)uVar4 << 4);
          if (pp_Var20 == (_func_int **)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puStack_40 = 1;
            bVar6 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                               ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
            if (!bVar6) goto LAB_0044311e;
            *puStack_40 = 0;
          }
        }
        delayChangeValueInfo.
        super_ReadOnlyList<DelayChangeValueInfo,_Memory::ArenaAllocator,_DefaultComparer>.buffer.
        _0_4_ = 0;
        delayChangeValueInfo.
        super_ReadOnlyList<DelayChangeValueInfo,_Memory::ArenaAllocator,_DefaultComparer>.alloc =
             (Type)CONCAT44(delayChangeValueInfo.
                            super_ReadOnlyList<DelayChangeValueInfo,_Memory::ArenaAllocator,_DefaultComparer>
                            .alloc._4_4_,uVar4);
        delayChangeValueInfo.
        super_ReadOnlyList<DelayChangeValueInfo,_Memory::ArenaAllocator,_DefaultComparer>.
        _vptr_ReadOnlyList = pp_Var20;
      }
      else {
        right = (int)delayChangeValueInfo.
                     super_ReadOnlyList<DelayChangeValueInfo,_Memory::ArenaAllocator,_DefaultComparer>
                     .alloc;
        lVar22 = (long)(int)delayChangeValueInfo.
                            super_ReadOnlyList<DelayChangeValueInfo,_Memory::ArenaAllocator,_DefaultComparer>
                            .alloc;
        if ((int)delayChangeValueInfo.
                 super_ReadOnlyList<DelayChangeValueInfo,_Memory::ArenaAllocator,_DefaultComparer>.
                 buffer ==
            (int)delayChangeValueInfo.
                 super_ReadOnlyList<DelayChangeValueInfo,_Memory::ArenaAllocator,_DefaultComparer>.
                 alloc ||
            (int)delayChangeValueInfo.
                 super_ReadOnlyList<DelayChangeValueInfo,_Memory::ArenaAllocator,_DefaultComparer>.
                 alloc < 0) {
          local_44 = 0;
          local_e4 = 0;
          local_98 = 0;
          bVar6 = Int32Math::Add((int)delayChangeValueInfo.
                                      super_ReadOnlyList<DelayChangeValueInfo,_Memory::ArenaAllocator,_DefaultComparer>
                                      .alloc,1,&local_44);
          if ((bVar6) || (bVar6 = Int32Math::Shl(local_44,1,&local_44), bVar6)) {
            JsUtil::ExternalApi::RaiseOnIntOverflow();
          }
          if (local_44 < 1) {
            local_44 = 0;
          }
          bVar6 = Int32Math::Mul(0x10,local_44,&local_e4);
          if ((bVar6) || (bVar6 = Int32Math::Mul(0x10,right,&local_98), bVar6)) {
            JsUtil::ExternalApi::RaiseOnIntOverflow();
          }
          uVar5 = delayChangeValueInfo.
                  super_ReadOnlyList<DelayChangeValueInfo,_Memory::ArenaAllocator,_DefaultComparer>.
                  _16_8_;
          if ((long)local_44 == 0) {
            dst = (_func_int **)&DAT_00000008;
          }
          else {
            requestedBytes = (long)local_44 << 4;
            if (local_44 < 0) {
              requestedBytes = 0xffffffffffffffff;
            }
            BVar10 = ExceptionCheck::CanHandleOutOfMemory();
            if (BVar10 == 0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puStack_40 = 1;
              bVar6 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                 ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                 "ExceptionCheck::CanHandleOutOfMemory()");
              if (!bVar6) goto LAB_0044311e;
              *puStack_40 = 0;
            }
            dst = (_func_int **)
                  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                  AllocInternal((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                 *)uVar5,requestedBytes);
            if (dst == (_func_int **)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puStack_40 = 1;
              bVar6 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                 ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
              if (!bVar6) goto LAB_0044311e;
              *puStack_40 = 0;
            }
          }
          lVar26 = (long)local_44;
          js_memcpy_s(dst,lVar26 << 4,pp_Var20,lVar22 << 4);
          if ((g_verifyIsNotBarrierAddress != (code *)0x0 & DAT_015d641c) == 1) {
            (*g_verifyIsNotBarrierAddress)(dst,lVar26);
          }
          Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
                    ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                     delayChangeValueInfo.
                     super_ReadOnlyList<DelayChangeValueInfo,_Memory::ArenaAllocator,_DefaultComparer>
                     ._16_8_,pp_Var20,(long)local_98);
          delayChangeValueInfo.
          super_ReadOnlyList<DelayChangeValueInfo,_Memory::ArenaAllocator,_DefaultComparer>.alloc =
               (Type)CONCAT44(delayChangeValueInfo.
                              super_ReadOnlyList<DelayChangeValueInfo,_Memory::ArenaAllocator,_DefaultComparer>
                              .alloc._4_4_,local_44);
          delayChangeValueInfo.
          super_ReadOnlyList<DelayChangeValueInfo,_Memory::ArenaAllocator,_DefaultComparer>.
          _vptr_ReadOnlyList = dst;
        }
      }
      lVar22 = (long)(int)delayChangeValueInfo.
                          super_ReadOnlyList<DelayChangeValueInfo,_Memory::ArenaAllocator,_DefaultComparer>
                          .buffer;
      delayChangeValueInfo.
      super_ReadOnlyList<DelayChangeValueInfo,_Memory::ArenaAllocator,_DefaultComparer>.buffer._0_4_
           = (int)delayChangeValueInfo.
                  super_ReadOnlyList<DelayChangeValueInfo,_Memory::ArenaAllocator,_DefaultComparer>.
                  buffer + 1;
      delayChangeValueInfo.
      super_ReadOnlyList<DelayChangeValueInfo,_Memory::ArenaAllocator,_DefaultComparer>.
      _vptr_ReadOnlyList[lVar22 * 2] = (_func_int *)pVVar13;
      delayChangeValueInfo.
      super_ReadOnlyList<DelayChangeValueInfo,_Memory::ArenaAllocator,_DefaultComparer>.
      _vptr_ReadOnlyList[lVar22 * 2 + 1] = (_func_int *)pAVar14;
    }
    JsUtil::
    BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::
    EntryIterator<const_JsUtil::BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
    ::MoveNext((EntryIterator<const_JsUtil::BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                *)local_128);
  } while( true );
}

Assistant:

void GlobOpt::InsertValueCompensation(
    BasicBlock *const predecessor,
    BasicBlock *const successor,
    const SymToValueInfoMap *symsRequiringCompensationToMergedValueInfoMap)
{
    Assert(predecessor);
    Assert(successor);
    AssertOrFailFast(predecessor != successor);
    Assert(symsRequiringCompensationToMergedValueInfoMap->Count() != 0);

    IR::Instr *insertBeforeInstr = predecessor->GetLastInstr();
    Func *const func = insertBeforeInstr->m_func;
    bool setLastInstrInPredecessor;
    // If this is a loop back edge, and the successor has been completed, don't attempt to update its block data.
    // The update is unnecessary, and the data has likely been freed.
    bool updateSuccessorBlockData = !this->isPerformingLoopBackEdgeCompensation || successor->GetDataUseCount() > 0;

    if(insertBeforeInstr->IsBranchInstr() || insertBeforeInstr->m_opcode == Js::OpCode::BailTarget)
    {
        // Don't insert code between the branch and the corresponding ByteCodeUses instructions
        while(insertBeforeInstr->m_prev->m_opcode == Js::OpCode::ByteCodeUses)
        {
            insertBeforeInstr = insertBeforeInstr->m_prev;
        }
        setLastInstrInPredecessor = false;
    }
    else
    {
        // Insert at the end of the block and set the last instruction
        Assert(insertBeforeInstr->m_next);
        insertBeforeInstr = insertBeforeInstr->m_next; // Instruction after the last instruction in the predecessor
        setLastInstrInPredecessor = true;
    }

    GlobOptBlockData &predecessorBlockData = predecessor->globOptData;
    GlobOptBlockData &successorBlockData = successor->globOptData;
    struct DelayChangeValueInfo
    {
        Value* predecessorValue;
        ArrayValueInfo* valueInfo;
        void ChangeValueInfo(BasicBlock* predecessor, GlobOpt* g)
        {
            g->ChangeValueInfo(
                predecessor,
                predecessorValue,
                valueInfo,
                false /*allowIncompatibleType*/,
                true /*compensated*/);
        }
    };
    JsUtil::List<DelayChangeValueInfo, ArenaAllocator> delayChangeValueInfo(alloc);
    for(auto it = symsRequiringCompensationToMergedValueInfoMap->GetIterator(); it.IsValid(); it.MoveNext())
    {
        const auto &entry = it.Current();
        Sym *const sym = entry.Key();
        Value *const predecessorValue = predecessorBlockData.FindValue(sym);
        Assert(predecessorValue);
        ValueInfo *const predecessorValueInfo = predecessorValue->GetValueInfo();

        // Currently, array value infos are the only ones that require compensation based on values
        Assert(predecessorValueInfo->IsAnyOptimizedArray());
        const ArrayValueInfo *const predecessorArrayValueInfo = predecessorValueInfo->AsArrayValueInfo();
        StackSym *const predecessorHeadSegmentSym = predecessorArrayValueInfo->HeadSegmentSym();
        StackSym *const predecessorHeadSegmentLengthSym = predecessorArrayValueInfo->HeadSegmentLengthSym();
        StackSym *const predecessorLengthSym = predecessorArrayValueInfo->LengthSym();
        ValueInfo *const mergedValueInfo = entry.Value();
        const ArrayValueInfo *const mergedArrayValueInfo = mergedValueInfo->AsArrayValueInfo();
        StackSym *const mergedHeadSegmentSym = mergedArrayValueInfo->HeadSegmentSym();
        StackSym *const mergedHeadSegmentLengthSym = mergedArrayValueInfo->HeadSegmentLengthSym();
        StackSym *const mergedLengthSym = mergedArrayValueInfo->LengthSym();
        Assert(!mergedHeadSegmentSym || predecessorHeadSegmentSym);
        Assert(!mergedHeadSegmentLengthSym || predecessorHeadSegmentLengthSym);
        Assert(!mergedLengthSym || predecessorLengthSym);

        bool compensated = false;
        if(mergedHeadSegmentSym && predecessorHeadSegmentSym != mergedHeadSegmentSym)
        {
            IR::Instr *const newInstr =
                IR::Instr::New(
                    Js::OpCode::Ld_A,
                    IR::RegOpnd::New(mergedHeadSegmentSym, mergedHeadSegmentSym->GetType(), func),
                    IR::RegOpnd::New(predecessorHeadSegmentSym, predecessorHeadSegmentSym->GetType(), func),
                    func);
            newInstr->GetDst()->SetIsJITOptimizedReg(true);
            newInstr->GetSrc1()->SetIsJITOptimizedReg(true);
            newInstr->SetByteCodeOffset(insertBeforeInstr);
            insertBeforeInstr->InsertBefore(newInstr);
            compensated = true;
        }

        if(mergedHeadSegmentLengthSym && predecessorHeadSegmentLengthSym != mergedHeadSegmentLengthSym)
        {
            IR::Instr *const newInstr =
                IR::Instr::New(
                    Js::OpCode::Ld_A,
                    IR::RegOpnd::New(mergedHeadSegmentLengthSym, mergedHeadSegmentLengthSym->GetType(), func),
                    IR::RegOpnd::New(predecessorHeadSegmentLengthSym, predecessorHeadSegmentLengthSym->GetType(), func),
                    func);
            newInstr->GetDst()->SetIsJITOptimizedReg(true);
            newInstr->GetSrc1()->SetIsJITOptimizedReg(true);
            newInstr->SetByteCodeOffset(insertBeforeInstr);
            insertBeforeInstr->InsertBefore(newInstr);
            compensated = true;

            // Merge the head segment length value
            Assert(predecessorBlockData.liveVarSyms->Test(predecessorHeadSegmentLengthSym->m_id));
            predecessorBlockData.liveVarSyms->Set(mergedHeadSegmentLengthSym->m_id);
            Value *const predecessorHeadSegmentLengthValue =
                predecessorBlockData.FindValue(predecessorHeadSegmentLengthSym);
            Assert(predecessorHeadSegmentLengthValue);
            predecessorBlockData.SetValue(predecessorHeadSegmentLengthValue, mergedHeadSegmentLengthSym);

            if (updateSuccessorBlockData)
            {
                successorBlockData.liveVarSyms->Set(mergedHeadSegmentLengthSym->m_id);
                Value *const mergedHeadSegmentLengthValue = successorBlockData.FindValue(mergedHeadSegmentLengthSym);
                if(mergedHeadSegmentLengthValue)
                {
                    Assert(mergedHeadSegmentLengthValue->GetValueNumber() != predecessorHeadSegmentLengthValue->GetValueNumber());
                    if(predecessorHeadSegmentLengthValue->GetValueInfo() != mergedHeadSegmentLengthValue->GetValueInfo())
                    {
                        mergedHeadSegmentLengthValue->SetValueInfo(
                            ValueInfo::MergeLikelyIntValueInfo(
                                this->alloc,
                                mergedHeadSegmentLengthValue,
                                predecessorHeadSegmentLengthValue,
                                mergedHeadSegmentLengthValue->GetValueInfo()->Type()
                                    .Merge(predecessorHeadSegmentLengthValue->GetValueInfo()->Type())));
                    }
                }
                else
                {
                    successorBlockData.SetValue(CopyValue(predecessorHeadSegmentLengthValue), mergedHeadSegmentLengthSym);
                }
            }
        }

        if(mergedLengthSym && predecessorLengthSym != mergedLengthSym)
        {
            IR::Instr *const newInstr =
                IR::Instr::New(
                    Js::OpCode::Ld_I4,
                    IR::RegOpnd::New(mergedLengthSym, mergedLengthSym->GetType(), func),
                    IR::RegOpnd::New(predecessorLengthSym, predecessorLengthSym->GetType(), func),
                    func);
            newInstr->GetDst()->SetIsJITOptimizedReg(true);
            newInstr->GetSrc1()->SetIsJITOptimizedReg(true);
            newInstr->SetByteCodeOffset(insertBeforeInstr);
            insertBeforeInstr->InsertBefore(newInstr);
            compensated = true;

            // Merge the length value
            Assert(predecessorBlockData.liveVarSyms->Test(predecessorLengthSym->m_id));
            predecessorBlockData.liveVarSyms->Set(mergedLengthSym->m_id);
            Value *const predecessorLengthValue = predecessorBlockData.FindValue(predecessorLengthSym);
            Assert(predecessorLengthValue);
            predecessorBlockData.SetValue(predecessorLengthValue, mergedLengthSym);

            if (updateSuccessorBlockData)
            {
                successorBlockData.liveVarSyms->Set(mergedLengthSym->m_id);
                Value *const mergedLengthValue = successorBlockData.FindValue(mergedLengthSym);
                if(mergedLengthValue)
                {
                    Assert(mergedLengthValue->GetValueNumber() != predecessorLengthValue->GetValueNumber());
                    if(predecessorLengthValue->GetValueInfo() != mergedLengthValue->GetValueInfo())
                    {
                        mergedLengthValue->SetValueInfo(
                            ValueInfo::MergeLikelyIntValueInfo(
                                this->alloc,
                                mergedLengthValue,
                                predecessorLengthValue,
                                mergedLengthValue->GetValueInfo()->Type().Merge(predecessorLengthValue->GetValueInfo()->Type())));
                    }
                }
                else
                {
                    successorBlockData.SetValue(CopyValue(predecessorLengthValue), mergedLengthSym);
                }
            }
        }

        if(compensated)
        {
            // Save the new ValueInfo for later.
            // We don't want other symbols needing compensation to see this new one
            delayChangeValueInfo.Add({
                predecessorValue,
                ArrayValueInfo::New(
                    alloc,
                    predecessorValueInfo->Type(),
                    mergedHeadSegmentSym ? mergedHeadSegmentSym : predecessorHeadSegmentSym,
                    mergedHeadSegmentLengthSym ? mergedHeadSegmentLengthSym : predecessorHeadSegmentLengthSym,
                    mergedLengthSym ? mergedLengthSym : predecessorLengthSym,
                    predecessorValueInfo->GetSymStore())
            });
        }
    }

    // Once we've compensated all the symbols, update the new ValueInfo.
    delayChangeValueInfo.Map([predecessor, this](int, DelayChangeValueInfo d) { d.ChangeValueInfo(predecessor, this); });

    if(setLastInstrInPredecessor)
    {
        predecessor->SetLastInstr(insertBeforeInstr->m_prev);
    }
}